

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O3

AST_Node * __thiscall
chaiscript::boxed_cast<chaiscript::AST_Node*>
          (chaiscript *this,Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  AST_Node *pAVar1;
  undefined8 *puVar2;
  type_info *ptVar3;
  type_info *ptVar4;
  bool bVar5;
  undefined8 *puVar6;
  Type_Conversions_State *extraout_RDX;
  Type_Conversions_State *extraout_RDX_00;
  Boxed_Value BVar7;
  undefined1 local_78 [16];
  uint local_68;
  undefined4 uStack_64;
  pointer_____offset_0x10___ *local_58;
  pointer_____offset_0x10___ *local_50;
  undefined4 local_48;
  
  if (bv != (Boxed_Value *)0x0) {
    local_78._0_8_ = &AST_Node*::typeinfo;
    local_78._8_8_ = &AST_Node::typeinfo;
    local_68 = 4;
    bVar5 = Type_Info::bare_equal(*(Type_Info **)this,(Type_Info *)local_78);
    t_conversions = extraout_RDX;
    if ((!bVar5) &&
       (bVar5 = Type_Conversions::convertable_type<chaiscript::AST_Node*>
                          ((Type_Conversions *)
                           (bv->m_data).
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr), t_conversions = extraout_RDX_00, bVar5)) {
      bVar5 = Type_Conversions::convertable_type<chaiscript::AST_Node*>
                        ((Type_Conversions *)
                         (bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      if (!bVar5) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x38);
        puVar2 = *(undefined8 **)this;
        _local_68 = puVar2[2];
        ptVar3 = (type_info *)*puVar2;
        ptVar4 = (type_info *)puVar2[1];
        *puVar6 = &PTR__bad_cast_0059eae8;
        local_78._0_4_ = SUB84(ptVar3,0);
        local_78._4_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
        local_78._8_4_ = SUB84(ptVar4,0);
        local_78._12_4_ = (undefined4)((ulong)ptVar4 >> 0x20);
        *(undefined4 *)(puVar6 + 1) = local_78._0_4_;
        *(undefined4 *)((long)puVar6 + 0xc) = local_78._4_4_;
        *(undefined4 *)(puVar6 + 2) = local_78._8_4_;
        *(undefined4 *)((long)puVar6 + 0x14) = local_78._12_4_;
        puVar6[3] = _local_68;
        puVar6[4] = &AST_Node*::typeinfo;
        puVar6[5] = 0x19;
        puVar6[6] = "Cannot perform boxed_cast";
        local_78._0_8_ = ptVar3;
        local_78._8_8_ = ptVar4;
        __cxa_throw(puVar6,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      local_58 = &AST_Node*::typeinfo;
      local_50 = &AST_Node::typeinfo;
      local_48 = 4;
      BVar7 = Type_Conversions::boxed_type_conversion
                        ((Type_Conversions *)local_78,
                         &((bv->m_data).
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_type_info,(Conversion_Saves *)&local_58,
                         (Boxed_Value *)
                         (bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
      pAVar1 = *(AST_Node **)(local_78._0_8_ + 0x20);
      detail::verify_type_no_throw<void>
                ((Boxed_Value *)local_78._0_8_,(type_info *)&AST_Node::typeinfo,
                 BVar7.m_data.
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return pAVar1;
      }
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      return pAVar1;
    }
  }
  pAVar1 = (AST_Node *)
           (*(Boxed_Value **)this)[2].m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  detail::verify_type_no_throw<void>
            (*(Boxed_Value **)this,(type_info *)&AST_Node::typeinfo,t_conversions);
  return pAVar1;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }